

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O2

void __thiscall
Hpipe::Instruction::apply_rec
          (Instruction *this,function<void_(Hpipe::Instruction_*)> *f,bool subgraphs)

{
  pointer pTVar1;
  Instruction *pIVar2;
  pointer pTVar3;
  function<void_(Hpipe::Instruction_*)> local_50;
  
  if (this->op_id != cur_op_id) {
    this->op_id = cur_op_id;
    std::function<void_(Hpipe::Instruction_*)>::operator()(f,this);
    pTVar1 = (this->next).super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
             super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pTVar3 = (this->next).super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                  super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
                  super__Vector_impl_data._M_start; pTVar3 != pTVar1; pTVar3 = pTVar3 + 1) {
      pIVar2 = pTVar3->inst;
      if (pIVar2 != (Instruction *)0x0) {
        std::function<void_(Hpipe::Instruction_*)>::function(&local_50,f);
        (*pIVar2->_vptr_Instruction[6])(pIVar2,&local_50,(ulong)subgraphs);
        std::_Function_base::~_Function_base(&local_50.super__Function_base);
      }
    }
  }
  return;
}

Assistant:

void Instruction::apply_rec( std::function<void (Instruction *)> f, bool subgraphs ) {
    if ( op_id == Instruction::cur_op_id )
        return;
    op_id = Instruction::cur_op_id;

    f( this );

    for( Transition &t : next )
        if ( t.inst )
            t.inst->apply_rec( f, subgraphs );
}